

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_snapshot_sync.cxx
# Opt level: O1

bool __thiscall nuraft::raft_server::check_snapshot_timeout(raft_server *this,ptr<peer> *pp)

{
  uint uVar1;
  element_type *peVar2;
  bool bVar3;
  int iVar4;
  uint64_t uVar5;
  ptr<snapshot_sync_ctx> sync_ctx;
  undefined1 local_50 [32];
  element_type local_30 [2];
  
  peer::get_snapshot_sync_ctx((peer *)local_50);
  if ((element_type *)local_50._0_8_ != (element_type *)0x0) {
    bVar3 = timer_helper::timeout((timer_helper *)(local_50._0_8_ + 0x28));
    if (bVar3) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 != (element_type *)0x0) {
        iVar4 = (**(code **)(*(long *)peVar2 + 0x38))();
        if (2 < iVar4) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          uVar1 = ((((pp->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                   config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->id_;
          uVar5 = timer_helper::get_ms((timer_helper *)(local_50._0_8_ + 0x28));
          msg_if_given_abi_cxx11_
                    ((string *)(local_50 + 0x10),
                     "snapshot install task for peer %d timed out: %lu ms, reset snapshot sync context %p"
                     ,(ulong)uVar1,uVar5,local_50._0_8_);
          (**(code **)(*(long *)peVar2 + 0x40))
                    (peVar2,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                     ,"check_snapshot_timeout",0x32,local_50 + 0x10);
          if ((element_type *)local_50._16_8_ != local_30) {
            operator_delete((void *)local_50._16_8_);
          }
        }
      }
      bVar3 = true;
      clear_snapshot_sync_ctx
                (this,(pp->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
      goto LAB_001e68ce;
    }
  }
  bVar3 = false;
LAB_001e68ce:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
  }
  return bVar3;
}

Assistant:

bool raft_server::check_snapshot_timeout(ptr<peer> pp) {
    ptr<snapshot_sync_ctx> sync_ctx = pp->get_snapshot_sync_ctx();
    if (!sync_ctx) return false;

    if ( sync_ctx->get_timer().timeout() ) {
        p_wn("snapshot install task for peer %d timed out: %" PRIu64 " ms, "
             "reset snapshot sync context %p",
             pp->get_id(), sync_ctx->get_timer().get_ms(), sync_ctx.get());
        clear_snapshot_sync_ctx(*pp);
        return true;
    }
    return false;
}